

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.h
# Opt level: O0

SilentAggregateSystem * __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::operator=
          (SilentAggregateSystem *this,SilentAggregateSystem *param_1)

{
  KUINT16 KVar1;
  SilentAggregateSystem *param_1_local;
  SilentAggregateSystem *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KVar1 = param_1->m_ui16Padding;
  this->m_ui16NumAggregates = param_1->m_ui16NumAggregates;
  this->m_ui16Padding = KVar1;
  AggregateType::operator=(&this->m_AggTyp,&param_1->m_AggTyp);
  return this;
}

Assistant:

class KDIS_EXPORT SilentAggregateSystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16NumAggregates;

    KUINT16 m_ui16Padding;

    AggregateType m_AggTyp;

public:

    static const KUINT16 SILENT_AGGREGATE_SYSTEM_SIZE = 12;

    SilentAggregateSystem();

    SilentAggregateSystem(KDataStream &stream) noexcept(false);

    SilentAggregateSystem( KUINT16 NumAggregates, const AggregateType & T );

    virtual ~SilentAggregateSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::SetNumberOfAggregates
    //              KDIS::DATA_TYPE::SilentAggregateSystem::GetNumberOfAggregates
    // Description: Number of aggregates of this type.
    // Parameter:   KUINT16 NOA
    //************************************
    void SetNumberOfAggregates( KUINT16 NOA );
    KUINT16 GetNumberOfAggregates() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::SetAggregateType
    //              KDIS::DATA_TYPE::SilentAggregateSystem::GetAggregateType
    // Description: Aggregate type for this record.
    // Parameter:   const AggregateType & A, void
    //************************************
    void SetAggregateType( const AggregateType & A );
    const AggregateType & GetAggregateType() const;
    AggregateType & GetAggregateType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentAggregateSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SilentAggregateSystem & Value ) const;
    KBOOL operator != ( const SilentAggregateSystem & Value ) const;
}